

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

wchar_t skip(archive_read *a)

{
  int __fd;
  void *pvVar1;
  
  pvVar1 = a->format->data;
  __fd = *(int *)((long)pvVar1 + 0x30);
  if (-1 < __fd) {
    close(__fd);
    *(undefined4 *)((long)pvVar1 + 0x30) = 0xffffffff;
  }
  return L'\0';
}

Assistant:

static int
skip(struct archive_read *a)
{
	struct mtree *mtree;

	mtree = (struct mtree *)(a->format->data);
	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}
	return (ARCHIVE_OK);
}